

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

void prvTidyCheckUrl(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  char *pcVar1;
  byte *str;
  bool bVar2;
  Node *node_00;
  int iVar3;
  uint uVar4;
  uint uVar5;
  tmbstr ptVar6;
  ulong uVar7;
  byte bVar8;
  int iVar9;
  undefined4 uVar10;
  ulong uVar11;
  int iVar12;
  ctmbstr s1;
  ulong uVar13;
  int iVar14;
  AttVal *av;
  int iVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint c;
  uint local_4c;
  AttVal *local_48;
  Node *local_40;
  byte *local_38;
  
  if ((attval == (AttVal *)0x0) || (s1 = attval->value, s1 == (ctmbstr)0x0)) {
    prvTidyReportAttrError(doc,node,attval,0x256);
    return;
  }
  local_40 = node;
  iVar3 = prvTidytmbstrncmp(s1,"javascript:",0xb);
  iVar12 = 0;
  iVar15 = 0;
  uVar4 = 0;
  do {
    bVar8 = s1[uVar4];
    if (bVar8 == 0x5c) {
      iVar15 = iVar15 + 1;
      if (*(int *)((doc->config).value + 0x1b) != 0 && iVar3 != 0) {
        s1[uVar4] = '/';
      }
    }
    else {
      if (bVar8 == 0) break;
      if (((byte)(bVar8 + 0x81) < 0xa2) || ((bVar8 | 2) == 0x3e)) {
        iVar12 = iVar12 + 1;
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
  local_48 = attval;
  if (*s1 == '\0') {
    bVar16 = true;
  }
  else {
    iVar14 = 0;
    do {
      uVar5 = prvTidyGetUTF8(s1,&local_4c);
      uVar4 = (local_4c & 0xffffffdf) - 0x41;
      if ((((0x19 < uVar4) &&
           (auVar18._0_4_ = -(uint)(local_4c == 0x25), auVar18._4_4_ = -(uint)(local_4c == 0x40),
           auVar18._8_4_ = -(uint)(local_4c == 0x5f), auVar18._12_4_ = -(uint)(local_4c == 0x7e),
           iVar9 = movmskps(uVar4,auVar18), iVar9 == 0)) &&
          (uVar4 = (local_4c & 0xfff8fffe) - 0x80000, 0xfffd < uVar4)) &&
         (auVar20._0_4_ = -(uint)((local_4c & 0xfffffffd) == 0x21),
         auVar20._4_4_ = -(uint)((local_4c & 0xfffffffd) == 0x24),
         auVar20._8_4_ = -(uint)((local_4c & 0xfffffffe) == 0x3a),
         auVar20._12_4_ = -(uint)((local_4c & 0xfffffffd) == 0x3d), uVar10 = movmskps(uVar4,auVar20)
         , (char)uVar10 == '\0')) {
        auVar17._0_4_ = -(uint)(-0x7ffffff7 < (int)(local_4c - 0x30 ^ 0x80000000));
        auVar17._4_4_ = -(uint)(-0x7ffffff8 < (int)(local_4c - 0x27 ^ 0x80000000));
        auVar17._8_4_ = -(uint)(-0x7fff28a1 < (int)(local_4c - 0xa0 ^ 0x80000000));
        auVar17._12_4_ = -(uint)(-0x7fffe231 < (int)(local_4c - 0xe000 ^ 0x80000000));
        auVar19._0_4_ = -(uint)(-0x7ffffe01 < (int)(local_4c - 0xfdf0 ^ 0x80000000));
        auVar19._4_4_ = -(uint)(-0x7fff0003 < (int)(local_4c - 0x10000 ^ 0x80000000));
        auVar19._8_4_ = -(uint)(-0x7fff0003 < (int)((local_4c & 0xfffefffe) - 0x20000 ^ 0x80000000))
        ;
        auVar19._12_4_ =
             -(uint)(-0x7fff0003 < (int)((local_4c & 0xfffcfffe) - 0x40000 ^ 0x80000000));
        auVar18 = packssdw(auVar17,auVar19);
        auVar18 = packsswb(auVar18,auVar18);
        if ((byte)(SUB161(auVar18 >> 7,0) & 1 | (SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar18 >> 0x17,0) & 1) << 2 | (SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar18 >> 0x27,0) & 1) << 4 | (SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar18 >> 0x37,0) & 1) << 6 | SUB161(auVar18 >> 0x3f,0) << 7) == 0xff) {
          iVar14 = iVar14 + (uint)(local_4c - 0x10fffe < 0xffff0002);
        }
      }
      pcVar1 = s1 + (uVar5 + 1);
      s1 = s1 + (uVar5 + 1);
    } while (*pcVar1 != '\0');
    bVar16 = iVar14 == 0;
  }
  av = local_48;
  if (iVar12 != 0 && *(int *)((doc->config).value + 0x1d) != 0) {
    str = (byte *)local_48->value;
    uVar5 = prvTidytmbstrlen((ctmbstr)str);
    ptVar6 = (tmbstr)(*doc->allocator->vtbl->alloc)
                               (doc->allocator,(long)uVar5 + (long)iVar12 * 2 + 1);
    bVar8 = *str;
    uVar7 = 0;
    local_38 = str;
    if (bVar8 != 0) {
      uVar13 = 1;
      bVar2 = false;
      uVar7 = 0;
      do {
        uVar11 = (ulong)bVar8;
        if ((byte)(bVar8 + 0x81) < 0xa2) {
          if (bVar8 != 0x20) {
LAB_0013b88c:
            iVar14 = sprintf(ptVar6 + uVar7,"%%%02X",uVar11);
            uVar4 = (int)uVar7 + iVar14;
            goto LAB_0013b896;
          }
          if (bVar2) {
            uVar11 = 0x20;
            goto LAB_0013b88c;
          }
          bVar2 = false;
        }
        else {
          if ((bVar8 | 2) == 0x3e) goto LAB_0013b88c;
          uVar4 = (int)uVar7 + 1;
          ptVar6[uVar7] = bVar8;
LAB_0013b896:
          uVar7 = (ulong)uVar4;
          bVar2 = true;
        }
        bVar8 = local_38[uVar13];
        uVar13 = (ulong)((int)uVar13 + 1);
        av = local_48;
      } while (bVar8 != 0);
    }
    ptVar6[uVar7] = '\0';
    (*doc->allocator->vtbl->free)(doc->allocator,av->value);
    av->value = ptVar6;
  }
  node_00 = local_40;
  if (iVar15 != 0) {
    uVar5 = 0x240;
    if (iVar3 == 0) {
      uVar5 = 0x229;
    }
    if (*(int *)((doc->config).value + 0x1b) == 0) {
      uVar5 = 0x229;
    }
    prvTidyReportAttrError(doc,local_40,av,uVar5);
  }
  if (iVar12 == 0) goto LAB_0013b95b;
  uVar5 = 0x23c;
  if (*(int *)((doc->config).value + 0x1d) == 0) {
    uVar4 = prvTidyHTMLVersion(doc);
    if ((uVar4 & 0x60000) == 0) {
      uVar5 = 0x245;
      goto LAB_0013b934;
    }
  }
  else {
LAB_0013b934:
    prvTidyReportAttrError(doc,node_00,av,uVar5);
  }
  *(byte *)&doc->badChars = (byte)doc->badChars | 0x20;
LAB_0013b95b:
  if (!bVar16) {
    prvTidyReportAttrError(doc,node_00,av,0x244);
  }
  return;
}

Assistant:

void TY_(CheckUrl)( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    tmbchar c;
    tmbstr dest, p;
    uint escape_count = 0, backslash_count = 0, bad_codepoint_count = 0;
    uint i, pos = 0;
    uint len;
    uint increment;
    Bool isJavascript = no;

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    p = attval->value;

    isJavascript =
        TY_(tmbstrncmp)(p,"javascript:",sizeof("javascript:")-1)==0;

    for (i = 0; '\0' != (c = p[i]); ++i)
    {
        if (c == '\\')
        {
            ++backslash_count;
            if ( cfgBool(doc, TidyFixBackslash) && !isJavascript)
                p[i] = '/';
        }
        else if ((c > 0x7e) || (c <= 0x20) || (strchr("<>", c)))
            ++escape_count;
    }

    while ( *p != 0 )
    {
        if ( !IsURLCodePoint( p, &increment ) )
            ++bad_codepoint_count;
         p = p + increment;
    }
    p = attval->value;

    if ( cfgBool(doc, TidyFixUri) && escape_count )
    {
        Bool hadnonspace = no;
        len = TY_(tmbstrlen)(p) + escape_count * 2 + 1;
        dest = (tmbstr) TidyDocAlloc(doc, len);
 
        for (i = 0; 0 != (c = p[i]); ++i)
        {
            if ((c > 0x7e) || (c <= 0x20) || (strchr("<>", c)))
            {
                if (c == 0x20)
                {
                    /* #345 - special case for leading spaces - discard */
                    if (hadnonspace)
                        pos += sprintf( dest + pos, "%%%02X", (byte)c );
                }
                else
                {
                    pos += sprintf( dest + pos, "%%%02X", (byte)c );
                    hadnonspace = yes;
                }
            }
            else
            {
                hadnonspace = yes;
                dest[pos++] = c;
            }
        }
        dest[pos] = 0;

        TidyDocFree(doc, attval->value);
        attval->value = dest;
    }
    if ( backslash_count )
    {
        if ( cfgBool(doc, TidyFixBackslash) && !isJavascript )
            TY_(ReportAttrError)( doc, node, attval, FIXED_BACKSLASH );
        else
            TY_(ReportAttrError)( doc, node, attval, BACKSLASH_IN_URI );
    }
    if ( escape_count )
    {
        if ( cfgBool(doc, TidyFixUri) )
            TY_(ReportAttrError)( doc, node, attval, ESCAPED_ILLEGAL_URI);
        else if ( !(TY_(HTMLVersion)(doc) & VERS_HTML5) )
            TY_(ReportAttrError)( doc, node, attval, ILLEGAL_URI_REFERENCE);

        doc->badChars |= BC_INVALID_URI;
    }
    if ( bad_codepoint_count )
    {
        TY_(ReportAttrError)( doc, node, attval, ILLEGAL_URI_CODEPOINT );
    }
}